

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_fails(void)

{
  int iVar1;
  uv_process_t *loop;
  undefined8 extraout_RAX;
  uv_process_options_t *loop_00;
  uv_process_t *puVar2;
  undefined8 in_R9;
  
  init_process_options("",fail_cb);
  loop_00 = &options;
  *options.args = "program-that-had-better-not-exist";
  options.file = "program-that-had-better-not-exist";
  loop = (uv_process_t *)uv_default_loop();
  puVar2 = &process;
  iVar1 = uv_spawn((uv_loop_t *)loop,&process,&options);
  if ((iVar1 != -0xd) && (iVar1 != -2)) goto LAB_00169a70;
  loop = &process;
  iVar1 = uv_is_active((uv_handle_t *)&process);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    loop = (uv_process_t *)uv_default_loop();
    puVar2 = (uv_process_t *)0x0;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00169a66;
    loop_00 = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop_00,close_walk_cb,(void *)0x0);
    puVar2 = (uv_process_t *)0x0;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    loop = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_fails_cold_1();
LAB_00169a66:
    run_test_spawn_fails_cold_2();
  }
  run_test_spawn_fails_cold_3();
LAB_00169a70:
  run_test_spawn_fails_cold_4();
  iVar1 = uv_exepath(exepath,&exepath_size);
  if (iVar1 == 0) {
    exepath[exepath_size] = '\0';
    args[0] = exepath;
    args[1] = (char *)loop;
    args[2] = (char *)0x0;
    args[3] = (char *)0x0;
    args[4] = (char *)0x0;
    options.file = exepath;
    options.args = args;
    options.exit_cb = (uv_exit_cb)puVar2;
    options.flags = 0;
    return 0x334480;
  }
  init_process_options_cold_1();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,0x51,"0 && \"fail_cb called\"",in_R9,extraout_RAX,loop_00);
  abort();
}

Assistant:

TEST_IMPL(spawn_fails) {
  int r;

  init_process_options("", fail_cb);
  options.file = options.args[0] = "program-that-had-better-not-exist";

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == UV_ENOENT || r == UV_EACCES);
  ASSERT(0 == uv_is_active((uv_handle_t*) &process));
  uv_close((uv_handle_t*) &process, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}